

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  string *psVar2;
  ulong uVar3;
  copyable *pcVar4;
  allocator local_112;
  allocator local_111;
  value local_110;
  value cfg;
  allocator local_f9;
  service srv;
  test_app app;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"- Basics no throw");
  std::endl<char,std::char_traits<char>>(poVar1);
  cppcms::json::value::copyable::copyable(&cfg.d);
  cppcms::json::value::value<char[12]>(&local_110,(char (*) [12])"en_US.UTF-8");
  std::__cxx11::string::string((string *)&app,"localization",&local_111);
  psVar2 = (string *)cppcms::json::value::operator[]((string *)&cfg);
  std::__cxx11::string::string((string *)&srv,"locales",&local_112);
  uVar3 = cppcms::json::value::operator[](psVar2);
  pcVar4 = (copyable *)cppcms::json::value::operator[](uVar3);
  cppcms::json::value::copyable::operator=(pcVar4,&local_110.d);
  std::__cxx11::string::~string((string *)&srv);
  std::__cxx11::string::~string((string *)&app);
  cppcms::json::value::copyable::~copyable(&local_110.d);
  cppcms::service::service((service *)&app,&cfg);
  basic_test((service *)&app,false);
  cppcms::service::~service((service *)&app);
  local_111 = (allocator)0x1;
  cppcms::json::value::value<bool>(&local_110,(bool *)&local_111);
  std::__cxx11::string::string((string *)&app,"misc",&local_112);
  psVar2 = (string *)cppcms::json::value::operator[]((string *)&cfg);
  std::__cxx11::string::string((string *)&srv,"invalid_url_throws",&local_f9);
  pcVar4 = (copyable *)cppcms::json::value::operator[](psVar2);
  cppcms::json::value::copyable::operator=(pcVar4,&local_110.d);
  std::__cxx11::string::~string((string *)&srv);
  std::__cxx11::string::~string((string *)&app);
  cppcms::json::value::copyable::~copyable(&local_110.d);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Basics throw");
  std::endl<char,std::char_traits<char>>(poVar1);
  cppcms::service::service((service *)&app,&cfg);
  basic_test((service *)&app,true);
  cppcms::service::~service((service *)&app);
  cppcms::service::service(&srv,&cfg);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Hierarchy ");
  std::endl<char,std::char_traits<char>>(poVar1);
  test_app::test_app(&app,&srv);
  test_app::test_hierarchy(&app);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Mappting");
  std::endl<char,std::char_traits<char>>(poVar1);
  test_app::test_mapping(&app);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Keyword substitution");
  std::endl<char,std::char_traits<char>>(poVar1);
  test_app::test_keywords(&app);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Dispatcher Test");
  std::endl<char,std::char_traits<char>>(poVar1);
  dispatcher_test(&srv);
  test_app::~test_app(&app);
  cppcms::service::~service(&srv);
  cppcms::json::value::copyable::~copyable(&cfg.d);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
	try {


		std::cout << "- Basics no throw" << std::endl;

		cppcms::json::value cfg;
		cfg["localization"]["locales"][0]="en_US.UTF-8";
		{
			cppcms::service srv(cfg);
			basic_test(srv,false);
		}

		cfg["misc"]["invalid_url_throws"]=true;
		std::cout << "- Basics throw" << std::endl;

		{
			cppcms::service srv(cfg);
			basic_test(srv,true);
		}

		cppcms::service srv(cfg);
		
		std::cout << "- Hierarchy " << std::endl;
		test_app app(srv);

		app.test_hierarchy();

		std::cout << "- Mappting" << std::endl;
		app.test_mapping();
		std::cout << "- Keyword substitution" << std::endl;
		app.test_keywords();

		std::cout << "- Dispatcher Test" << std::endl;
		dispatcher_test(srv);

	}
	catch(std::exception const &e) {
		std::cerr << "Fail: " << e.what() << std::endl;
		return 1;
	}
	std::cout << "ok" << std::endl;
	return 0;
}